

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

_Bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,_Bool border,ImGuiWindowFlags flags
                         )

{
  uint uVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiWindow_conflict *window;
  bool bVar3;
  ImGuiContext_conflict *pIVar4;
  _Bool _Var5;
  byte bVar6;
  float fVar7;
  ImGuiWindow_conflict *child_window;
  _Bool ret;
  float backup_border_size;
  int auto_fit_axises;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiWindow_conflict *parent_window;
  ImGuiContext_conflict *g;
  ImGuiWindowFlags flags_local;
  _Bool border_local;
  ImVec2 *size_arg_local;
  ImGuiID id_local;
  char *name_local;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  uVar1 = pIVar2->Flags;
  size = GetContentRegionAvail();
  _backup_border_size = ImFloor(size_arg);
  bVar3 = backup_border_size == 0.0;
  bVar6 = 0;
  if ((float)auto_fit_axises == 0.0) {
    bVar6 = 2;
  }
  if (backup_border_size <= 0.0) {
    fVar7 = ImMax<float>(size.x + backup_border_size,4.0);
    backup_border_size = fVar7;
  }
  if ((float)auto_fit_axises <= 0.0) {
    fVar7 = ImMax<float>(size.y + (float)auto_fit_axises,4.0);
    auto_fit_axises = (int)fVar7;
  }
  SetNextWindowSize((ImVec2 *)&backup_border_size,0);
  if (name == (char *)0x0) {
    ImFormatString(pIVar4->TempBuffer,0xc01,"%s/%08X",pIVar2->Name,(ulong)id);
  }
  else {
    ImFormatString(pIVar4->TempBuffer,0xc01,"%s/%s_%08X",pIVar2->Name,name,(ulong)id);
  }
  fVar7 = (pIVar4->Style).ChildBorderSize;
  if (!border) {
    (pIVar4->Style).ChildBorderSize = 0.0;
  }
  _Var5 = Begin(pIVar4->TempBuffer,(_Bool *)0x0,flags | 0x1200103U | uVar1 & 4);
  (pIVar4->Style).ChildBorderSize = fVar7;
  window = pIVar4->CurrentWindow;
  window->ChildId = id;
  window->AutoFitChildAxises = bVar3 | bVar6;
  if (window->BeginCount == 1) {
    (pIVar2->DC).CursorPos = window->Pos;
  }
  if (((pIVar4->NavActivateId == id) && ((flags & 0x800000U) == 0)) &&
     (((window->DC).NavLayersActiveMask != 0 || (((window->DC).NavHasScroll & 1U) != 0)))) {
    FocusWindow(window);
    NavInitWindow(window,false);
    SetActiveID(id + 1,window);
    pIVar4->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return _Var5;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_NoDocking;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    if (name)
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(g.TempBuffer, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayersActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id + 1, child_window); // Steal ActiveId with another arbitrary id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}